

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

TZDBNames * icu_63::TZDBTimeZoneNames::getMetaZoneNames(UnicodeString *mzID,UErrorCode *status)

{
  short sVar1;
  int iVar2;
  TZDBNames *pTVar3;
  UResourceBundle *pUVar4;
  TZDBNames *pTVar5;
  UChar *key_00;
  UChar mzIDKey [129];
  char key [129];
  Char16Ptr local_1d0;
  char16_t *local_1c8;
  char16_t local_1b8 [136];
  char local_a8 [136];
  
  umtx_initOnce((UInitOnce *)&gTZDBNamesMapInitOnce,initTZDBNamesMap,status);
  if (U_ZERO_ERROR < *status) {
    return (TZDBNames *)0x0;
  }
  local_1d0.p_ = local_1b8;
  UnicodeString::extract(mzID,&local_1d0,0x81,status);
  local_1c8 = local_1d0.p_;
  sVar1 = (mzID->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (mzID->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  local_1b8[iVar2] = L'\0';
  umtx_lock_63((UMutex *)gTZDBNamesMapLock);
  pTVar3 = (TZDBNames *)uhash_get_63(gTZDBNamesMap,local_1b8);
  if (pTVar3 != (TZDBNames *)0x0) {
    pTVar5 = (TZDBNames *)0x0;
    if (pTVar3 != (TZDBNames *)"<empty>") {
      pTVar5 = pTVar3;
    }
    goto LAB_00212ff5;
  }
  pUVar4 = ures_openDirect_63("icudt63l-zone","tzdbNames",status);
  pUVar4 = ures_getByKey_63(pUVar4,"zoneStrings",pUVar4,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    mergeTimeZoneKey(mzID,local_a8);
    pTVar5 = TZDBNames::createInstance(pUVar4,local_a8);
    key_00 = ZoneMeta::findMetaZoneID(mzID);
    if (key_00 == (UChar *)0x0) {
      if (pTVar5 != (TZDBNames *)0x0) goto LAB_00212fe1;
      goto LAB_00212fea;
    }
    pTVar3 = (TZDBNames *)"<empty>";
    if (pTVar5 != (TZDBNames *)0x0) {
      pTVar3 = pTVar5;
    }
    uhash_put_63(gTZDBNamesMap,key_00,pTVar3,status);
    if ((pTVar5 != (TZDBNames *)0x0) && (U_ZERO_ERROR < *status)) {
LAB_00212fe1:
      (*pTVar5->_vptr_TZDBNames[1])(pTVar5);
      goto LAB_00212fea;
    }
  }
  else {
LAB_00212fea:
    pTVar5 = (TZDBNames *)0x0;
  }
  ures_close_63(pUVar4);
LAB_00212ff5:
  umtx_unlock_63((UMutex *)gTZDBNamesMapLock);
  return pTVar5;
}

Assistant:

const TZDBNames*
TZDBTimeZoneNames::getMetaZoneNames(const UnicodeString& mzID, UErrorCode& status) {
    umtx_initOnce(gTZDBNamesMapInitOnce, &initTZDBNamesMap, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    TZDBNames* tzdbNames = NULL;

    UChar mzIDKey[ZID_KEY_MAX + 1];
    mzID.extract(mzIDKey, ZID_KEY_MAX + 1, status);
    U_ASSERT(status == U_ZERO_ERROR);   // already checked length above
    mzIDKey[mzID.length()] = 0;

    umtx_lock(&gTZDBNamesMapLock);
    {
        void *cacheVal = uhash_get(gTZDBNamesMap, mzIDKey);
        if (cacheVal == NULL) {
            UResourceBundle *zoneStringsRes = ures_openDirect(U_ICUDATA_ZONE, "tzdbNames", &status);
            zoneStringsRes = ures_getByKey(zoneStringsRes, gZoneStrings, zoneStringsRes, &status);
            if (U_SUCCESS(status)) {
                char key[ZID_KEY_MAX + 1];
                mergeTimeZoneKey(mzID, key);
                tzdbNames = TZDBNames::createInstance(zoneStringsRes, key);

                if (tzdbNames == NULL) {
                    cacheVal = (void *)EMPTY;
                } else {
                    cacheVal = tzdbNames;
                }
                // Use the persistent ID as the resource key, so we can
                // avoid duplications.
                // TODO: Is there a more efficient way, like intern() in Java?
                void* newKey = (void*) ZoneMeta::findMetaZoneID(mzID);
                if (newKey != NULL) {
                    uhash_put(gTZDBNamesMap, newKey, cacheVal, &status);
                    if (U_FAILURE(status)) {
                        if (tzdbNames != NULL) {
                            delete tzdbNames;
                            tzdbNames = NULL;
                        }
                    }
                } else {
                    // Should never happen with a valid input
                    if (tzdbNames != NULL) {
                        // It's not possible that we get a valid tzdbNames with unknown ID.
                        // But just in case..
                        delete tzdbNames;
                        tzdbNames = NULL;
                    }
                }
            }
            ures_close(zoneStringsRes);
        } else if (cacheVal != EMPTY) {
            tzdbNames = (TZDBNames *)cacheVal;
        }
    }
    umtx_unlock(&gTZDBNamesMapLock);

    return tzdbNames;
}